

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

void __thiscall
DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::MoveElementTo
          (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
           *this,PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *element,
          DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
          *list)

{
  DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *pDVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  NodeBase *node;
  
  node = (NodeBase *)(element[-1].decommitPages.data + 4);
  bVar3 = HasNode(this,node);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x1a9,"(HasNode(node))","HasNode(node)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pDVar1 = (node->next).base;
  **(long **)&element[-1].freePageCount = (long)pDVar1;
  pDVar1->prev = *(anon_union_8_3_7fb8a913_for_prev *)&element[-1].freePageCount;
  pDVar1 = (list->
           super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).
           next.base;
  *(anon_union_8_3_7fb8a913_for_prev *)&element[-1].freePageCount = pDVar1->prev;
  (node->next).base = pDVar1;
  (((pDVar1->prev).base)->next).base = node;
  (pDVar1->prev).base = node;
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  (list->super_RealCount).count = (list->super_RealCount).count + 1;
  return;
}

Assistant:

void MoveElementTo(TData * element, DListBase * list)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        DListBase::InsertNodeBefore(list->Next(), node);
        this->DecrementCount();
        list->IncrementCount();
    }